

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

reference __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::operator()
          (View<short,_true,_std::allocator<unsigned_long>_> *this,size_t value)

{
  size_t sVar1;
  size_t local_28;
  size_t offset;
  size_t value_local;
  View<short,_true,_std::allocator<unsigned_long>_> *this_local;
  
  offset = value;
  value_local = (size_t)this;
  testInvariant(this);
  sVar1 = dimension(this);
  if (sVar1 == 0) {
    marray_detail::Assert<bool>(offset == 0);
    this_local = *(View<short,_true,_std::allocator<unsigned_long>_> **)this;
  }
  else {
    indexToOffset(this,offset,&local_28);
    this_local = (View<short,_true,_std::allocator<unsigned_long>_> *)(*(long *)this + local_28 * 2)
    ;
  }
  return (reference)this_local;
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value
) const
{
    testInvariant();    
    if(dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || value == 0);
        return data_[0];
    }
    else {
        std::size_t offset;
        indexToOffset(value, offset);
        return data_[offset];
    }
}